

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_1ec8eb::writeCopyReadMIP
               (char *fileName1,char *fileName2,int width,int height,int xSize,int ySize,int xOffset
               ,int yOffset,Compression comp,LevelRoundingMode rmode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  void *this;
  Compression *pCVar9;
  LineOrder *pLVar10;
  InputFile *this_00;
  Array2D<half> *pAVar11;
  half *phVar12;
  ostream *this_01;
  float *pfVar13;
  V2f *this_02;
  V2f *v;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  TiledOutputFile *in_RDI;
  uint in_R8D;
  uint in_R9D;
  float fVar14;
  float fVar15;
  int in_stack_00000008;
  int in_stack_00000010;
  Compression in_stack_00000018;
  LevelRoundingMode in_stack_00000020;
  int x;
  int y;
  int l;
  FrameBuffer fb2;
  FrameBuffer fb1;
  int levelHeight_1;
  int levelWidth_1;
  int level_1;
  Array<Imf_2_5::Array2D<half>_> levels2;
  Array<Imf_2_5::Array2D<half>_> levels1;
  int numLevels_1;
  int dy;
  int dx;
  Box2i *dw;
  TiledInputFile in2;
  TiledInputFile in1;
  TiledOutputFile out_1;
  InputFile in;
  FrameBuffer fb;
  int levelHeight;
  int levelWidth;
  int level;
  int numLevels;
  TiledOutputFile out;
  Array<Imf_2_5::Array2D<half>_> levels;
  Header hdr;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  int in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  int in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffa60;
  float in_stack_fffffffffffffa64;
  long in_stack_fffffffffffffa68;
  Array2D<half> *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  float in_stack_fffffffffffffa7c;
  Header *in_stack_fffffffffffffa80;
  Box2i *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  long in_stack_fffffffffffffaa8;
  Array<Imf_2_5::Array2D<half>_> *in_stack_fffffffffffffab0;
  long in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  LineOrder LVar16;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  undefined8 in_stack_fffffffffffffc08;
  TiledOutputFile *pTVar17;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined8 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  int in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  TiledOutputFile *this_03;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 uVar18;
  char *name;
  undefined4 in_stack_fffffffffffffd00;
  Compression CVar19;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Slice local_2e0;
  Slice local_2a8 [2];
  int local_20c;
  int local_208;
  int local_204;
  Array local_200 [16];
  Array local_1f0 [20];
  int local_1dc;
  int local_1d8;
  int local_1d4;
  Box2i *local_1d0;
  TiledInputFile local_1c8 [4];
  InputFile local_188;
  Slice local_178;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  Array local_e0 [8];
  Array2D<half> *in_stack_ffffffffffffff28;
  TiledInputFile *in_stack_ffffffffffffff30;
  Channel local_bc;
  Vec2<float> local_a0;
  Vec2<int> local_98;
  Vec2<int> local_90 [3];
  Vec2<int> local_78;
  Vec2<int> local_70;
  FrameBuffer *in_stack_ffffffffffffff98;
  TiledOutputFile *in_stack_ffffffffffffffa0;
  char local_58 [56];
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  char *local_10;
  TiledOutputFile *local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar8 = std::operator<<((ostream *)&std::cout,"levelMode 1, ");
  poVar8 = std::operator<<(poVar8,"compression ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000018);
  poVar8 = std::operator<<(poVar8,", roundingMode ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000020);
  poVar8 = std::operator<<(poVar8,", xOffset ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_stack_00000008);
  poVar8 = std::operator<<(poVar8,", yOffset ");
  this = (void *)std::ostream::operator<<(poVar8,in_stack_00000010);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  uVar18 = 0;
  Imath_2_5::Vec2<int>::Vec2(&local_70,0,0);
  Imath_2_5::Vec2<int>::Vec2(&local_78,local_14 + -1,local_18 + -1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  Imath_2_5::Vec2<int>::Vec2(local_90,in_stack_00000008,in_stack_00000010);
  Imath_2_5::Vec2<int>::Vec2
            (&local_98,in_stack_00000008 + -1 + local_14,in_stack_00000010 + -1 + local_18);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  Imath_2_5::Vec2<float>::Vec2(&local_a0,0.0,0.0);
  name = local_58;
  Imf_2_5::Header::Header
            ((Header *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,(Box2i *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
             (V2f *)in_stack_fffffffffffffa70,(float)((ulong)in_stack_fffffffffffffa68 >> 0x20),
             (LineOrder)in_stack_fffffffffffffa68,(Compression)in_stack_fffffffffffffa64);
  CVar19 = in_stack_00000018;
  pCVar9 = Imf_2_5::Header::compression((Header *)0x20ae0c);
  *pCVar9 = CVar19;
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x20ae34);
  *pLVar10 = INCREASING_Y;
  Imf_2_5::Header::channels((Header *)0x20ae59);
  Imf_2_5::Channel::Channel(&local_bc,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)CONCAT44(CVar19,in_stack_fffffffffffffd00),name,
             (Channel *)CONCAT44(uVar18,in_stack_fffffffffffffcf0));
  Imf_2_5::TileDescription::TileDescription
            ((TileDescription *)&stack0xffffffffffffff34,local_1c,local_20,MIPMAP_LEVELS,
             in_stack_00000020);
  Imf_2_5::Header::setTileDescription
            (in_stack_fffffffffffffa80,
             (TileDescription *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array((Array<Imf_2_5::Array2D<half>_> *)local_e0);
  this_00 = (InputFile *)std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  remove((char *)local_8);
  this_03 = local_8;
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledOutputFile::TiledOutputFile
            (this_03,(char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (Header *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc7c);
  iVar3 = Imf_2_5::TiledOutputFile::numLevels
                    ((TiledOutputFile *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  local_104 = iVar3;
  Imf_2_5::Array<Imf_2_5::Array2D<half>_>::resizeErase
            ((Array<Imf_2_5::Array2D<half>_> *)
             CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),in_stack_fffffffffffffad8
            );
  local_108 = 0;
  while (iVar7 = local_108,
        iVar4 = Imf_2_5::TiledOutputFile::numLevels
                          ((TiledOutputFile *)
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)),
        iVar7 < iVar4) {
    in_stack_fffffffffffffc80 =
         Imf_2_5::TiledOutputFile::levelWidth
                   ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20)
                    ,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_10c = in_stack_fffffffffffffc80;
    in_stack_fffffffffffffc7c =
         Imf_2_5::TiledOutputFile::levelHeight
                   ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20)
                    ,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_110 = in_stack_fffffffffffffc7c;
    Imf_2_5::Array::operator_cast_to_Array2D_(local_e0);
    Imf_2_5::Array2D<half>::resizeErase
              (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    Imf_2_5::Array::operator_cast_to_Array2D_(local_e0);
    fillPixels((Array2D<half> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58);
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b0dd);
    pAVar11 = Imf_2_5::Array::operator_cast_to_Array2D_(local_e0);
    phVar12 = Imf_2_5::Array2D<half>::operator[](pAVar11 + local_108,(long)-in_stack_00000010);
    in_stack_fffffffffffffa58 = 0;
    in_stack_fffffffffffffa50 = 0;
    in_stack_fffffffffffffa48 = 1;
    Imf_2_5::Slice::Slice
              (&local_178,HALF,(char *)(phVar12 + -in_stack_00000008),2,(long)local_10c * 2,1,1,0.0,
               false,false);
    Imf_2_5::FrameBuffer::insert
              ((FrameBuffer *)CONCAT44(CVar19,in_stack_fffffffffffffd00),name,
               (Slice *)CONCAT44(uVar18,in_stack_fffffffffffffcf0));
    Imf_2_5::TiledOutputFile::setFrameBuffer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Imf_2_5::TiledOutputFile::numXTiles
              ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    Imf_2_5::TiledOutputFile::numYTiles
              ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    Imf_2_5::TiledOutputFile::writeTiles
              ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20b228);
    local_108 = local_108 + 1;
  }
  Imf_2_5::TiledOutputFile::~TiledOutputFile
            ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  poVar8 = std::operator<<((ostream *)&std::cout," copying");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  remove(local_10);
  Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile
            (this_00,(char *)CONCAT44(iVar2,in_stack_fffffffffffffc98),(int)((ulong)this_03 >> 0x20)
            );
  Imf_2_5::InputFile::header(&local_188);
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledOutputFile::TiledOutputFile
            (this_03,(char *)CONCAT44(iVar3,iVar4),
             (Header *)CONCAT44(iVar7,in_stack_fffffffffffffc80),in_stack_fffffffffffffc7c);
  Imf_2_5::TiledOutputFile::copyPixels
            ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
             (InputFile *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  Imf_2_5::TiledOutputFile::~TiledOutputFile
            ((TiledOutputFile *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  Imf_2_5::InputFile::~InputFile
            ((InputFile *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  poVar8 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  pTVar17 = local_8;
  iVar5 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledInputFile::TiledInputFile
            ((TiledInputFile *)this_03,(char *)CONCAT44(iVar3,iVar4),iVar7);
  iVar6 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledInputFile::TiledInputFile
            ((TiledInputFile *)this_03,(char *)CONCAT44(iVar3,iVar4),iVar7);
  Imf_2_5::TiledInputFile::header(local_1c8);
  local_1d0 = Imf_2_5::Header::dataWindow((Header *)0x20b493);
  local_1d4 = (local_1d0->min).x;
  local_1d8 = (local_1d0->min).y;
  local_1dc = Imf_2_5::TiledInputFile::numLevels
                        ((TiledInputFile *)CONCAT44(iVar6,in_stack_fffffffffffffc00));
  Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  Imf_2_5::Array<Imf_2_5::Array2D<half>_>::Array
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  for (local_204 = 0; local_204 < local_1dc; local_204 = local_204 + 1) {
    local_208 = Imf_2_5::TiledInputFile::levelWidth
                          ((TiledInputFile *)CONCAT44(iVar2,in_stack_fffffffffffffc20),
                           (int)((ulong)poVar8 >> 0x20));
    local_20c = Imf_2_5::TiledInputFile::levelHeight
                          ((TiledInputFile *)CONCAT44(iVar2,in_stack_fffffffffffffc20),
                           (int)((ulong)poVar8 >> 0x20));
    Imf_2_5::Array::operator_cast_to_Array2D_(local_1f0);
    Imf_2_5::Array2D<half>::resizeErase
              (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    Imf_2_5::Array::operator_cast_to_Array2D_(local_200);
    Imf_2_5::Array2D<half>::resizeErase
              (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b630);
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x20b63d);
    pAVar11 = Imf_2_5::Array::operator_cast_to_Array2D_(local_1f0);
    phVar12 = Imf_2_5::Array2D<half>::operator[](pAVar11 + local_204,(long)-local_1d8);
    Imf_2_5::Slice::Slice
              (local_2a8,HALF,(char *)(phVar12 + -local_1d4),2,(long)local_208 * 2,1,1,0.0,false,
               false);
    Imf_2_5::FrameBuffer::insert
              ((FrameBuffer *)CONCAT44(CVar19,in_stack_fffffffffffffd00),name,
               (Slice *)CONCAT44(uVar18,in_stack_fffffffffffffcf0));
    pAVar11 = Imf_2_5::Array::operator_cast_to_Array2D_(local_200);
    phVar12 = Imf_2_5::Array2D<half>::operator[](pAVar11 + local_204,(long)-local_1d8);
    in_stack_fffffffffffffa58 = 0;
    iVar3 = 0;
    Imf_2_5::Slice::Slice
              (&local_2e0,HALF,(char *)(phVar12 + -local_1d4),2,(long)local_208 * 2,1,1,0.0,false,
               false);
    Imf_2_5::FrameBuffer::insert
              ((FrameBuffer *)CONCAT44(CVar19,in_stack_fffffffffffffd00),name,
               (Slice *)CONCAT44(uVar18,in_stack_fffffffffffffcf0));
    Imf_2_5::TiledInputFile::setFrameBuffer
              (in_stack_ffffffffffffff30,(FrameBuffer *)in_stack_ffffffffffffff28);
    Imf_2_5::TiledInputFile::setFrameBuffer
              (in_stack_ffffffffffffff30,(FrameBuffer *)in_stack_ffffffffffffff28);
    Imf_2_5::TiledInputFile::numXTiles
              ((TiledInputFile *)CONCAT44(iVar5,in_stack_fffffffffffffc10),
               (int)((ulong)pTVar17 >> 0x20));
    Imf_2_5::TiledInputFile::numYTiles
              ((TiledInputFile *)CONCAT44(iVar5,in_stack_fffffffffffffc10),
               (int)((ulong)pTVar17 >> 0x20));
    Imf_2_5::TiledInputFile::readTiles
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,iVar3,
               in_stack_fffffffffffffa4c);
    Imf_2_5::TiledInputFile::numXTiles
              ((TiledInputFile *)CONCAT44(iVar5,in_stack_fffffffffffffc10),
               (int)((ulong)pTVar17 >> 0x20));
    Imf_2_5::TiledInputFile::numYTiles
              ((TiledInputFile *)CONCAT44(iVar5,in_stack_fffffffffffffc10),
               (int)((ulong)pTVar17 >> 0x20));
    Imf_2_5::TiledInputFile::readTiles
              ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,iVar3,
               in_stack_fffffffffffffa4c);
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20b8c6);
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x20b8d3);
  }
  this_01 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  Imf_2_5::TiledInputFile::header(local_1c8);
  Imf_2_5::Header::displayWindow((Header *)0x20ba32);
  Imf_2_5::Header::displayWindow((Header *)0x20ba49);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  if (!bVar1) {
    __assert_fail("in2.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x129,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  Imf_2_5::Header::dataWindow((Header *)0x20bac3);
  Imf_2_5::Header::dataWindow((Header *)0x20bada);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  if (!bVar1) {
    __assert_fail("in2.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x12a,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  pfVar13 = Imf_2_5::Header::pixelAspectRatio((Header *)0x20bb54);
  fVar14 = *pfVar13;
  pfVar13 = Imf_2_5::Header::pixelAspectRatio((Header *)0x20bb80);
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in2.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,299,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  this_02 = Imf_2_5::Header::screenWindowCenter((Header *)0x20bbe7);
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x20bbfe);
  bVar1 = Imath_2_5::Vec2<float>::operator==(this_02,v);
  if (!bVar1) {
    __assert_fail("in2.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,300,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  pfVar13 = Imf_2_5::Header::screenWindowWidth((Header *)0x20bc68);
  fVar14 = *pfVar13;
  pfVar13 = Imf_2_5::Header::screenWindowWidth((Header *)0x20bc94);
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in2.header().screenWindowWidth() == hdr.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x12d,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x20bcfb);
  LVar16 = *pLVar10;
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x20bd23);
  if (LVar16 != *pLVar10) {
    __assert_fail("in2.header().lineOrder() == hdr.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x12e,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  pCVar9 = Imf_2_5::Header::compression((Header *)0x20bd85);
  CVar19 = *pCVar9;
  pCVar9 = Imf_2_5::Header::compression((Header *)0x20bdaa);
  if (CVar19 != *pCVar9) {
    __assert_fail("in2.header().compression() == hdr.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x12f,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  Imf_2_5::TiledInputFile::header(local_1c8);
  Imf_2_5::Header::channels((Header *)0x20be03);
  Imf_2_5::Header::channels((Header *)0x20be17);
  bVar1 = Imf_2_5::ChannelList::operator==
                    ((ChannelList *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                     (ChannelList *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  if (!bVar1) {
    __assert_fail("in2.header().channels() == hdr.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                  ,0x130,
                  "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                 );
  }
  local_2e4 = 0;
  do {
    if (local_1dc <= local_2e4) {
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array
                ((Array<Imf_2_5::Array2D<half>_> *)in_stack_fffffffffffffa70);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array
                ((Array<Imf_2_5::Array2D<half>_> *)in_stack_fffffffffffffa70);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)in_stack_fffffffffffffa80);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)in_stack_fffffffffffffa80);
      remove((char *)local_8);
      remove(local_10);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      Imf_2_5::Array<Imf_2_5::Array2D<half>_>::~Array
                ((Array<Imf_2_5::Array2D<half>_> *)in_stack_fffffffffffffa70);
      Imf_2_5::Header::~Header
                ((Header *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      return;
    }
    local_2e8 = 0;
    while (iVar3 = local_2e8,
          iVar7 = Imf_2_5::TiledInputFile::levelHeight
                            ((TiledInputFile *)CONCAT44(iVar2,in_stack_fffffffffffffc20),
                             (int)((ulong)poVar8 >> 0x20)), iVar3 < iVar7) {
      local_2ec = 0;
      while (iVar3 = local_2ec,
            iVar7 = Imf_2_5::TiledInputFile::levelWidth
                              ((TiledInputFile *)CONCAT44(iVar2,in_stack_fffffffffffffc20),
                               (int)((ulong)poVar8 >> 0x20)), iVar3 < iVar7) {
        pAVar11 = Imf_2_5::Array::operator_cast_to_Array2D_(local_200);
        phVar12 = Imf_2_5::Array2D<half>::operator[](pAVar11 + local_2e4,(long)local_2e8);
        fVar14 = half::operator_cast_to_float(phVar12 + local_2ec);
        in_stack_fffffffffffffa80 = (Header *)Imf_2_5::Array::operator_cast_to_Array2D_(local_1f0);
        phVar12 = Imf_2_5::Array2D<half>::operator[]
                            ((Array2D<half> *)
                             ((long)&(in_stack_fffffffffffffa80->_map)._M_t._M_impl.field_0x0 +
                             (long)local_2e4 * 3 * 8),(long)local_2e8);
        fVar15 = half::operator_cast_to_float(phVar12 + local_2ec);
        if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
          __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                        ,0x136,
                        "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                       );
        }
        if ((in_stack_00000018 != B44_COMPRESSION) && (in_stack_00000018 != B44A_COMPRESSION)) {
          in_stack_fffffffffffffa70 = Imf_2_5::Array::operator_cast_to_Array2D_(local_200);
          phVar12 = Imf_2_5::Array2D<half>::operator[]
                              (in_stack_fffffffffffffa70 + local_2e4,(long)local_2e8);
          in_stack_fffffffffffffa64 = half::operator_cast_to_float(phVar12 + local_2ec);
          pAVar11 = Imf_2_5::Array::operator_cast_to_Array2D_(local_e0);
          phVar12 = Imf_2_5::Array2D<half>::operator[](pAVar11 + local_2e4,(long)local_2e8);
          fVar14 = half::operator_cast_to_float(phVar12 + local_2ec);
          if ((in_stack_fffffffffffffa64 != fVar14) ||
             (NAN(in_stack_fffffffffffffa64) || NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledCopyPixels.cpp"
                          ,0x139,
                          "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                         );
          }
        }
        local_2ec = local_2ec + 1;
      }
      local_2e8 = local_2e8 + 1;
    }
    local_2e4 = local_2e4 + 1;
  } while( true );
}

Assistant:

void
writeCopyReadMIP (const char fileName1[],
		  const char fileName2[],
		  int width,
		  int height,
		  int xSize, 
		  int ySize,
		  int xOffset,
		  int yOffset,
		  Compression comp,
		  LevelRoundingMode rmode)
{
    cout << "levelMode 1, " << "compression " << comp <<
	    ", roundingMode " << rmode <<
            ", xOffset " << xOffset << ", yOffset " << yOffset << endl;
    
    Header hdr ((Box2i (V2i (0, 0),			// display window
                        V2i (width - 1, height -1))),
                (Box2i (V2i (xOffset, yOffset),		// data window
                        V2i (xOffset + width - 1, yOffset + height - 1))));

    hdr.compression() = comp;
    hdr.lineOrder() = INCREASING_Y;
    hdr.channels().insert ("H", Channel (HALF, 1, 1));
    
    hdr.setTileDescription(TileDescription(xSize, ySize, MIPMAP_LEVELS, rmode));
    
    Array < Array2D<half> > levels;

    {
        cout << " writing" << flush;

        remove (fileName1);
        TiledOutputFile out (fileName1, hdr);
        
        int numLevels = out.numLevels();
	levels.resizeErase (numLevels);

        for (int level = 0; level < out.numLevels(); ++level)
        {
            int levelWidth  = out.levelWidth(level);
            int levelHeight = out.levelHeight(level);
            levels[level].resizeErase(levelHeight, levelWidth);
            fillPixels (levels[level], levelWidth, levelHeight);
            
            FrameBuffer fb; 

            fb.insert ("H",
                       Slice (HALF,
                              (char *) &levels[level][-yOffset][-xOffset],
                              sizeof (levels[level][0][0]),
                              sizeof (levels[level][0][0]) * levelWidth));
        
            out.setFrameBuffer (fb);
            out.writeTiles (0, out.numXTiles(level) - 1,
                            0, out.numYTiles(level) - 1, level);
        }        
    }

    {
        cout << " copying" << flush;

        remove (fileName2);
        InputFile in (fileName1);
        TiledOutputFile out (fileName2, in.header());
        out.copyPixels (in);
    }

    {
        cout << " reading" << flush;

        TiledInputFile in1 (fileName1);
        TiledInputFile in2 (fileName2);

        const Box2i &dw = in2.header().dataWindow();
        int dx = dw.min.x;
        int dy = dw.min.y;

        int numLevels = in2.numLevels();
        Array < Array2D<half> > levels1 (numLevels);
        Array < Array2D<half> > levels2 (numLevels);

        for (int level = 0; level < numLevels; ++level)
        {
            int levelWidth = in2.levelWidth(level);
            int levelHeight = in2.levelHeight(level);
            levels1[level].resizeErase(levelHeight, levelWidth);
            levels2[level].resizeErase(levelHeight, levelWidth);

            FrameBuffer fb1; 
            FrameBuffer fb2; 

            fb1.insert ("H",
                        Slice (HALF,
                               (char *) &levels1[level][-dy][-dx],
                               sizeof (levels1[level][0][0]),
                               sizeof (levels1[level][0][0]) * levelWidth));

            fb2.insert ("H",
                        Slice (HALF,
                               (char *) &levels2[level][-dy][-dx],
                               sizeof (levels2[level][0][0]),
                               sizeof (levels2[level][0][0]) * levelWidth));

            in1.setFrameBuffer (fb1);
            in2.setFrameBuffer (fb2);

            in1.readTiles (0, in1.numXTiles(level) - 1,
                           0, in1.numYTiles(level) - 1, level);

            in2.readTiles (0, in2.numXTiles(level) - 1,
                           0, in2.numYTiles(level) - 1, level);
        }

        cout << " comparing" << flush;

        assert (in2.header().displayWindow() == hdr.displayWindow());
        assert (in2.header().dataWindow() == hdr.dataWindow());
        assert (in2.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in2.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in2.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in2.header().lineOrder() == hdr.lineOrder());
        assert (in2.header().compression() == hdr.compression());
        assert (in2.header().channels() == hdr.channels());

        for (int l = 0; l < numLevels; ++l)
            for (int y = 0; y < in1.levelHeight(l); ++y)
                for (int x = 0; x < in1.levelWidth(l); ++x)                    
		{
                    assert ((levels2[l])[y][x] == (levels1[l])[y][x]);

		    if (comp != B44_COMPRESSION && comp != B44A_COMPRESSION)
			assert ((levels2[l])[y][x] == (levels[l])[y][x]);
		}
    }

    remove (fileName1);
    remove (fileName2);
    cout << endl;
}